

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcd.c
# Opt level: O0

void tcd_malloc_decode_tile
               (opj_tcd_t *tcd,opj_image_t *image,opj_cp_t *cp,int tileno,
               opj_codestream_info_t *cstr_info)

{
  int iVar1;
  uint uVar2;
  long lVar3;
  int iVar4;
  int b;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int *piVar11;
  uint *puVar12;
  int *piVar13;
  void *pvVar14;
  int *piVar15;
  int *piVar16;
  uint *puVar17;
  int *piVar18;
  opj_tgt_tree_t *poVar19;
  undefined8 *puVar20;
  byte bVar21;
  byte bVar22;
  int in_ECX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  bool bVar23;
  bool bVar24;
  double dVar25;
  opj_tcd_cblk_dec_t *cblk;
  int cblkyend;
  int cblkxend;
  int cblkystart;
  int cblkxstart;
  opj_tcd_precinct_t *prc;
  int cbgyend;
  int cbgxend;
  int cbgystart;
  int cbgxstart;
  int brcblkyend;
  int brcblkxend;
  int tlcblkystart;
  int tlcblkxstart;
  opj_tcd_band_t *band;
  opj_stepsize_t *ss;
  int numbps;
  int gain;
  int y0b;
  int x0b;
  opj_tcd_resolution_t *res;
  int cblkheightexpn;
  int cblkwidthexpn;
  int cbgheightexpn;
  int cbgwidthexpn;
  int brcbgyend;
  int brcbgxend;
  int tlcbgystart;
  int tlcbgxstart;
  int brprcyend;
  int brprcxend;
  int tlprcystart;
  int tlprcxstart;
  int levelno;
  int pdy;
  int pdx;
  opj_tcd_tilecomp_t *tilec;
  opj_tccp_t *tccp;
  opj_tcd_tile_t *tile;
  opj_tcp_t *tcp;
  int cblkno;
  int precno;
  int bandno;
  int resno;
  int compno;
  int local_128;
  int local_124;
  int local_114;
  int local_110;
  int local_10c;
  uint local_94;
  uint local_90;
  int local_84;
  int local_80;
  uint local_68;
  uint local_64;
  int local_3c;
  int local_38;
  int local_34;
  int local_30;
  int local_2c;
  
  *(long *)(in_RDI + 0x30) = in_RDX;
  lVar3 = *(long *)(in_RDX + 0x80);
  iVar1 = *(int *)(*(long *)(in_RDX + 0x50) + (long)in_ECX * 4);
  piVar11 = (int *)(*(long *)(*(long *)(in_RDI + 0x20) + 8) +
                   (long)*(int *)(*(long *)(in_RDX + 0x50) + (long)in_ECX * 4) * 0x358);
  for (local_2c = 0; local_2c < piVar11[4]; local_2c = local_2c + 1) {
    puVar12 = (uint *)(*(long *)(lVar3 + (long)iVar1 * 0x15e8 + 0x15e0) + (long)local_2c * 0x438);
    piVar13 = (int *)(*(long *)(piVar11 + 6) + (long)local_2c * 0x30);
    iVar4 = int_ceildiv(*piVar11,*(int *)(*(long *)(in_RSI + 0x18) + (long)local_2c * 0x38));
    *piVar13 = iVar4;
    iVar4 = int_ceildiv(piVar11[1],*(int *)(*(long *)(in_RSI + 0x18) + (long)local_2c * 0x38 + 4));
    piVar13[1] = iVar4;
    iVar4 = int_ceildiv(piVar11[2],*(int *)(*(long *)(in_RSI + 0x18) + (long)local_2c * 0x38));
    piVar13[2] = iVar4;
    iVar4 = int_ceildiv(piVar11[3],*(int *)(*(long *)(in_RSI + 0x18) + (long)local_2c * 0x38 + 4));
    piVar13[3] = iVar4;
    piVar13[4] = puVar12[1];
    pvVar14 = malloc((long)piVar13[4] * 0x98);
    *(void **)(piVar13 + 6) = pvVar14;
    for (local_30 = 0; local_30 < piVar13[4]; local_30 = local_30 + 1) {
      b = (piVar13[4] + -1) - local_30;
      piVar15 = (int *)(*(long *)(piVar13 + 6) + (long)local_30 * 0x98);
      iVar4 = int_ceildivpow2(*piVar13,b);
      *piVar15 = iVar4;
      iVar4 = int_ceildivpow2(piVar13[1],b);
      piVar15[1] = iVar4;
      iVar4 = int_ceildivpow2(piVar13[2],b);
      piVar15[2] = iVar4;
      iVar4 = int_ceildivpow2(piVar13[3],b);
      piVar15[3] = iVar4;
      iVar4 = 3;
      if (local_30 == 0) {
        iVar4 = 1;
      }
      piVar15[6] = iVar4;
      if ((*puVar12 & 1) == 0) {
        local_64 = 0xf;
        local_68 = 0xf;
      }
      else {
        local_64 = puVar12[(long)local_30 + 0xcb];
        local_68 = puVar12[(long)local_30 + 0xec];
      }
      local_80 = int_floordivpow2(*piVar15,local_64);
      bVar21 = (byte)local_64;
      local_80 = local_80 << (bVar21 & 0x1f);
      local_84 = int_floordivpow2(piVar15[1],local_68);
      bVar22 = (byte)local_68;
      local_84 = local_84 << (bVar22 & 0x1f);
      iVar4 = int_ceildivpow2(piVar15[2],local_64);
      iVar4 = iVar4 << (bVar21 & 0x1f);
      iVar5 = int_ceildivpow2(piVar15[3],local_68);
      iVar5 = iVar5 << (bVar22 & 0x1f);
      if (*piVar15 == piVar15[2]) {
        local_10c = 0;
      }
      else {
        local_10c = iVar4 - local_80 >> (bVar21 & 0x1f);
      }
      piVar15[4] = local_10c;
      if (piVar15[1] == piVar15[3]) {
        local_110 = 0;
      }
      else {
        local_110 = iVar5 - local_84 >> (bVar22 & 0x1f);
      }
      piVar15[5] = local_110;
      if (local_30 == 0) {
        local_90 = local_64;
        local_94 = local_68;
      }
      else {
        local_80 = int_ceildivpow2(local_80,1);
        local_84 = int_ceildivpow2(local_84,1);
        int_ceildivpow2(iVar4,1);
        int_ceildivpow2(iVar5,1);
        local_90 = local_64 - 1;
        local_94 = local_68 - 1;
      }
      iVar4 = int_min(puVar12[2],local_90);
      iVar5 = int_min(puVar12[3],local_94);
      for (local_34 = 0; local_34 < piVar15[6]; local_34 = local_34 + 1) {
        piVar16 = piVar15 + (long)local_34 * 10 + 8;
        if (local_30 == 0) {
          local_114 = 0;
        }
        else {
          local_114 = local_34 + 1;
        }
        piVar16[4] = local_114;
        bVar23 = true;
        if (piVar16[4] != 1) {
          bVar23 = piVar16[4] == 3;
        }
        bVar24 = true;
        if (piVar16[4] != 2) {
          bVar24 = piVar16[4] == 3;
        }
        if (piVar16[4] == 0) {
          iVar6 = int_ceildivpow2(*piVar13,b);
          *piVar16 = iVar6;
          iVar6 = int_ceildivpow2(piVar13[1],b);
          piVar16[1] = iVar6;
          iVar6 = int_ceildivpow2(piVar13[2],b);
          piVar16[2] = iVar6;
          iVar6 = int_ceildivpow2(piVar13[3],b);
          piVar16[3] = iVar6;
        }
        else {
          bVar21 = (byte)b;
          iVar6 = int_ceildivpow2(*piVar13 - (1 << (bVar21 & 0x1f)) * (uint)bVar23,b + 1);
          *piVar16 = iVar6;
          iVar6 = int_ceildivpow2(piVar13[1] - (1 << (bVar21 & 0x1f)) * (uint)bVar24,b + 1);
          piVar16[1] = iVar6;
          iVar6 = int_ceildivpow2(piVar13[2] - (1 << (bVar21 & 0x1f)) * (uint)bVar23,b + 1);
          piVar16[2] = iVar6;
          iVar6 = int_ceildivpow2(piVar13[3] - (1 << (bVar21 & 0x1f)) * (uint)bVar24,b + 1);
          piVar16[3] = iVar6;
        }
        if (local_30 == 0) {
          local_124 = 0;
        }
        else {
          local_124 = (local_30 + -1) * 3 + local_34 + 1;
        }
        puVar17 = puVar12 + (long)local_124 * 2 + 7;
        if (puVar12[5] == 0) {
          local_128 = dwt_getgain_real(piVar16[4]);
        }
        else {
          local_128 = dwt_getgain(piVar16[4]);
        }
        uVar2 = puVar17[1];
        dVar25 = pow(2.0,(double)(int)((*(int *)(*(long *)(in_RSI + 0x18) + (long)local_2c * 0x38 +
                                                0x18) + local_128) - *puVar17));
        piVar16[9] = (int)(float)(((double)(int)uVar2 / 2048.0 + 1.0) * dVar25 * 0.5);
        piVar16[8] = *puVar17 + puVar12[0xc9] + -1;
        pvVar14 = malloc((long)(piVar15[4] * piVar15[5]) * 0x30);
        *(void **)(piVar16 + 6) = pvVar14;
        for (local_38 = 0; local_38 < piVar15[4] * piVar15[5]; local_38 = local_38 + 1) {
          iVar6 = local_80 + (local_38 % piVar15[4]) * (1 << ((byte)local_90 & 0x1f));
          iVar7 = local_84 + (local_38 / piVar15[4]) * (1 << ((byte)local_94 & 0x1f));
          piVar18 = (int *)(*(long *)(piVar16 + 6) + (long)local_38 * 0x30);
          iVar8 = int_max(iVar6,*piVar16);
          *piVar18 = iVar8;
          iVar8 = int_max(iVar7,piVar16[1]);
          piVar18[1] = iVar8;
          iVar6 = int_min(iVar6 + (1 << ((byte)local_90 & 0x1f)),piVar16[2]);
          piVar18[2] = iVar6;
          iVar6 = int_min(iVar7 + (1 << ((byte)local_94 & 0x1f)),piVar16[3]);
          piVar18[3] = iVar6;
          iVar6 = int_floordivpow2(*piVar18,iVar4);
          bVar21 = (byte)iVar4;
          iVar6 = iVar6 << (bVar21 & 0x1f);
          iVar7 = int_floordivpow2(piVar18[1],iVar5);
          bVar22 = (byte)iVar5;
          iVar7 = iVar7 << (bVar22 & 0x1f);
          iVar8 = int_ceildivpow2(piVar18[2],iVar4);
          iVar9 = int_ceildivpow2(piVar18[3],iVar5);
          piVar18[4] = (iVar8 << (bVar21 & 0x1f)) - iVar6 >> (bVar21 & 0x1f);
          piVar18[5] = (iVar9 << (bVar22 & 0x1f)) - iVar7 >> (bVar22 & 0x1f);
          pvVar14 = malloc((long)(piVar18[4] * piVar18[5]) * 0x38);
          *(void **)(piVar18 + 6) = pvVar14;
          poVar19 = tgt_create((int)((ulong)in_RDI >> 0x20),(int)in_RDI);
          *(opj_tgt_tree_t **)(piVar18 + 8) = poVar19;
          poVar19 = tgt_create((int)((ulong)in_RDI >> 0x20),(int)in_RDI);
          *(opj_tgt_tree_t **)(piVar18 + 10) = poVar19;
          for (local_3c = 0; local_3c < piVar18[4] * piVar18[5]; local_3c = local_3c + 1) {
            iVar8 = iVar6 + (local_3c % piVar18[4]) * (1 << (bVar21 & 0x1f));
            iVar9 = iVar7 + (local_3c / piVar18[4]) * (1 << (bVar22 & 0x1f));
            puVar20 = (undefined8 *)(*(long *)(piVar18 + 6) + (long)local_3c * 0x38);
            *puVar20 = 0;
            puVar20[1] = 0;
            iVar10 = int_max(iVar8,*piVar18);
            *(int *)(puVar20 + 2) = iVar10;
            iVar10 = int_max(iVar9,piVar18[1]);
            *(int *)((long)puVar20 + 0x14) = iVar10;
            iVar8 = int_min(iVar8 + (1 << (bVar21 & 0x1f)),piVar18[2]);
            *(int *)(puVar20 + 3) = iVar8;
            iVar8 = int_min(iVar9 + (1 << (bVar22 & 0x1f)),piVar18[3]);
            *(int *)((long)puVar20 + 0x1c) = iVar8;
            *(undefined4 *)(puVar20 + 6) = 0;
          }
        }
      }
    }
  }
  return;
}

Assistant:

void tcd_malloc_decode_tile(opj_tcd_t *tcd, opj_image_t * image, opj_cp_t * cp, int tileno, opj_codestream_info_t *cstr_info) {
	int compno, resno, bandno, precno, cblkno;
	opj_tcp_t *tcp;
	opj_tcd_tile_t *tile;

	OPJ_ARG_NOT_USED(cstr_info);

	tcd->cp = cp;
	
	tcp = &(cp->tcps[cp->tileno[tileno]]);
	tile = &(tcd->tcd_image->tiles[cp->tileno[tileno]]);
	
	tileno = cp->tileno[tileno];
	
	for (compno = 0; compno < tile->numcomps; compno++) {
		opj_tccp_t *tccp = &tcp->tccps[compno];
		opj_tcd_tilecomp_t *tilec = &tile->comps[compno];
		
		/* border of each tile component (global) */
		tilec->x0 = int_ceildiv(tile->x0, image->comps[compno].dx);
		tilec->y0 = int_ceildiv(tile->y0, image->comps[compno].dy);
		tilec->x1 = int_ceildiv(tile->x1, image->comps[compno].dx);
		tilec->y1 = int_ceildiv(tile->y1, image->comps[compno].dy);

		tilec->numresolutions = tccp->numresolutions;
		tilec->resolutions = (opj_tcd_resolution_t *) opj_malloc(tilec->numresolutions * sizeof(opj_tcd_resolution_t));
		
		for (resno = 0; resno < tilec->numresolutions; resno++) {
			int pdx, pdy;
			int levelno = tilec->numresolutions - 1 - resno;
			int tlprcxstart, tlprcystart, brprcxend, brprcyend;
			int tlcbgxstart, tlcbgystart, brcbgxend, brcbgyend;
			int cbgwidthexpn, cbgheightexpn;
			int cblkwidthexpn, cblkheightexpn;
			
			opj_tcd_resolution_t *res = &tilec->resolutions[resno];
			
			/* border for each resolution level (global) */
			res->x0 = int_ceildivpow2(tilec->x0, levelno);
			res->y0 = int_ceildivpow2(tilec->y0, levelno);
			res->x1 = int_ceildivpow2(tilec->x1, levelno);
			res->y1 = int_ceildivpow2(tilec->y1, levelno);
			res->numbands = resno == 0 ? 1 : 3;
			
			/* p. 35, table A-23, ISO/IEC FDIS154444-1 : 2000 (18 august 2000) */
			if (tccp->csty & J2K_CCP_CSTY_PRT) {
				pdx = tccp->prcw[resno];
				pdy = tccp->prch[resno];
			} else {
				pdx = 15;
				pdy = 15;
			}			
			
			/* p. 64, B.6, ISO/IEC FDIS15444-1 : 2000 (18 august 2000)  */
			tlprcxstart = int_floordivpow2(res->x0, pdx) << pdx;
			tlprcystart = int_floordivpow2(res->y0, pdy) << pdy;
			brprcxend = int_ceildivpow2(res->x1, pdx) << pdx;
			brprcyend = int_ceildivpow2(res->y1, pdy) << pdy;
			
			res->pw = (res->x0 == res->x1) ? 0 : ((brprcxend - tlprcxstart) >> pdx);
			res->ph = (res->y0 == res->y1) ? 0 : ((brprcyend - tlprcystart) >> pdy);
			
			if (resno == 0) {
				tlcbgxstart = tlprcxstart;
				tlcbgystart = tlprcystart;
				brcbgxend = brprcxend;
				brcbgyend = brprcyend;
				cbgwidthexpn = pdx;
				cbgheightexpn = pdy;
			} else {
				tlcbgxstart = int_ceildivpow2(tlprcxstart, 1);
				tlcbgystart = int_ceildivpow2(tlprcystart, 1);
				brcbgxend = int_ceildivpow2(brprcxend, 1);
				brcbgyend = int_ceildivpow2(brprcyend, 1);
				cbgwidthexpn = pdx - 1;
				cbgheightexpn = pdy - 1;
			}
			
			cblkwidthexpn = int_min(tccp->cblkw, cbgwidthexpn);
			cblkheightexpn = int_min(tccp->cblkh, cbgheightexpn);
			
			for (bandno = 0; bandno < res->numbands; bandno++) {
				int x0b, y0b;
				int gain, numbps;
				opj_stepsize_t *ss = NULL;
				
				opj_tcd_band_t *band = &res->bands[bandno];
				band->bandno = resno == 0 ? 0 : bandno + 1;
				x0b = (band->bandno == 1) || (band->bandno == 3) ? 1 : 0;
				y0b = (band->bandno == 2) || (band->bandno == 3) ? 1 : 0;
				
				if (band->bandno == 0) {
					/* band border (global) */
					band->x0 = int_ceildivpow2(tilec->x0, levelno);
					band->y0 = int_ceildivpow2(tilec->y0, levelno);
					band->x1 = int_ceildivpow2(tilec->x1, levelno);
					band->y1 = int_ceildivpow2(tilec->y1, levelno);
				} else {
					/* band border (global) */
					band->x0 = int_ceildivpow2(tilec->x0 - (1 << levelno) * x0b, levelno + 1);
					band->y0 = int_ceildivpow2(tilec->y0 - (1 << levelno) * y0b, levelno + 1);
					band->x1 = int_ceildivpow2(tilec->x1 - (1 << levelno) * x0b, levelno + 1);
					band->y1 = int_ceildivpow2(tilec->y1 - (1 << levelno) * y0b, levelno + 1);
				}
				
				ss = &tccp->stepsizes[resno == 0 ? 0 : 3 * (resno - 1) + bandno + 1];
				gain = tccp->qmfbid == 0 ? dwt_getgain_real(band->bandno) : dwt_getgain(band->bandno);
				numbps = image->comps[compno].prec + gain;
				band->stepsize = (float)(((1.0 + ss->mant / 2048.0) * pow(2.0, numbps - ss->expn)) * 0.5);
				band->numbps = ss->expn + tccp->numgbits - 1;	/* WHY -1 ? */
				
				band->precincts = (opj_tcd_precinct_t *) opj_malloc(res->pw * res->ph * sizeof(opj_tcd_precinct_t));
				
				for (precno = 0; precno < res->pw * res->ph; precno++) {
					int tlcblkxstart, tlcblkystart, brcblkxend, brcblkyend;
					int cbgxstart = tlcbgxstart + (precno % res->pw) * (1 << cbgwidthexpn);
					int cbgystart = tlcbgystart + (precno / res->pw) * (1 << cbgheightexpn);
					int cbgxend = cbgxstart + (1 << cbgwidthexpn);
					int cbgyend = cbgystart + (1 << cbgheightexpn);
					
					opj_tcd_precinct_t *prc = &band->precincts[precno];
					/* precinct size (global) */
					prc->x0 = int_max(cbgxstart, band->x0);
					prc->y0 = int_max(cbgystart, band->y0);
					prc->x1 = int_min(cbgxend, band->x1);
					prc->y1 = int_min(cbgyend, band->y1);
					
					tlcblkxstart = int_floordivpow2(prc->x0, cblkwidthexpn) << cblkwidthexpn;
					tlcblkystart = int_floordivpow2(prc->y0, cblkheightexpn) << cblkheightexpn;
					brcblkxend = int_ceildivpow2(prc->x1, cblkwidthexpn) << cblkwidthexpn;
					brcblkyend = int_ceildivpow2(prc->y1, cblkheightexpn) << cblkheightexpn;
					prc->cw = (brcblkxend - tlcblkxstart) >> cblkwidthexpn;
					prc->ch = (brcblkyend - tlcblkystart) >> cblkheightexpn;

					prc->cblks.dec = (opj_tcd_cblk_dec_t*) opj_malloc(prc->cw * prc->ch * sizeof(opj_tcd_cblk_dec_t));

					prc->incltree = tgt_create(prc->cw, prc->ch);
					prc->imsbtree = tgt_create(prc->cw, prc->ch);
					
					for (cblkno = 0; cblkno < prc->cw * prc->ch; cblkno++) {
						int cblkxstart = tlcblkxstart + (cblkno % prc->cw) * (1 << cblkwidthexpn);
						int cblkystart = tlcblkystart + (cblkno / prc->cw) * (1 << cblkheightexpn);
						int cblkxend = cblkxstart + (1 << cblkwidthexpn);
						int cblkyend = cblkystart + (1 << cblkheightexpn);					

						opj_tcd_cblk_dec_t* cblk = &prc->cblks.dec[cblkno];
						cblk->data = NULL;
						cblk->segs = NULL;
						/* code-block size (global) */
						cblk->x0 = int_max(cblkxstart, prc->x0);
						cblk->y0 = int_max(cblkystart, prc->y0);
						cblk->x1 = int_min(cblkxend, prc->x1);
						cblk->y1 = int_min(cblkyend, prc->y1);
						cblk->numsegs = 0;
					}
				} /* precno */
			} /* bandno */
		} /* resno */
	} /* compno */
	/* tcd_dump(stdout, tcd, &tcd->tcd_image); */
}